

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.h
# Opt level: O3

Extension * __thiscall
google::protobuf::internal::ExtensionSet::FindOrNull(ExtensionSet *this,int key)

{
  ushort uVar1;
  KeyValue *pKVar2;
  FieldDescriptor *pFVar3;
  Extension *pEVar4;
  KeyValue *pKVar5;
  difference_type __d;
  ulong uVar6;
  ulong uVar8;
  FieldDescriptor *pFVar9;
  ulong uVar7;
  
  pKVar5 = (this->map_).flat;
  if (this->flat_capacity_ < 0x101) {
    uVar1 = this->flat_size_;
    uVar7 = (ulong)uVar1;
    pKVar2 = pKVar5 + uVar1;
    if (uVar1 != 0) {
      do {
        uVar6 = uVar7 >> 1;
        uVar8 = uVar6;
        if (pKVar5[uVar6].first < key) {
          uVar8 = ~uVar6 + uVar7;
          pKVar5 = pKVar5 + uVar6 + 1;
        }
        uVar7 = uVar8;
      } while (0 < (long)uVar8);
    }
    if (pKVar5 != pKVar2) {
      pEVar4 = (Extension *)0x0;
      if (pKVar5->first == key) {
        pEVar4 = &pKVar5->second;
      }
      return pEVar4;
    }
  }
  else {
    pFVar3 = *(FieldDescriptor **)&(pKVar5->second).type;
    if (pFVar3 != (FieldDescriptor *)0x0) {
      pFVar9 = (FieldDescriptor *)&pKVar5->second;
      do {
        if (key <= *(int *)((long)pFVar3 + 0x20)) {
          pFVar9 = pFVar3;
        }
        pFVar3 = *(FieldDescriptor **)
                  (pFVar3 + (ulong)(*(int *)((long)pFVar3 + 0x20) < key) * 8 + 0x10);
      } while (pFVar3 != (FieldDescriptor *)0x0);
      if ((Extension *)pFVar9 != &pKVar5->second) {
        pEVar4 = (Extension *)0x0;
        if (*(int *)((long)pFVar9 + 0x18 + 8) <= key) {
          pEVar4 = (Extension *)((long)pFVar9 + 0x18 + 0x10);
        }
        return pEVar4;
      }
    }
  }
  return (Extension *)0x0;
}

Assistant:

bool is_large() const { return flat_capacity_ > kMaximumFlatCapacity; }